

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O1

int glu::TextureTestUtil::computeTextureLookupDiff
              (ConstPixelBufferAccess *result,ConstPixelBufferAccess *reference,
              PixelBufferAccess *errorMask,Texture2DArrayView *baseView,float *texCoord,
              ReferenceParams *sampleParams,LookupPrecision *lookupPrec,LodPrecision *lodPrec,
              qpWatchDog *watchDog)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  ulong uVar6;
  bool bVar7;
  int i;
  long lVar8;
  long lVar9;
  ulong uVar10;
  int y;
  int lodOffsNdx;
  int z;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  Texture2DArrayView TVar20;
  Vec2 coordDxo;
  Vector<bool,_4> res_7;
  Vec2 lodO;
  Vec2 srcSize;
  Vec2 lodBounds;
  Vector<float,_4> res_5;
  Vec2 coordDy;
  Vec4 refPix;
  Vec4 resPix;
  Vec3 triW [2];
  Vec3 triR [2];
  Vec3 triT [2];
  Vec3 triS [2];
  Vec2 lodBias;
  Vec2 lodOffsets [4];
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> srcLevelStorage;
  Texture2DArrayView src;
  undefined1 local_268 [24];
  float local_250 [2];
  undefined8 local_248;
  int local_23c;
  float local_238;
  float local_234;
  float local_230;
  float local_22c;
  undefined8 local_228;
  float local_220 [4];
  float local_210;
  float local_20c;
  float local_208 [2];
  ulong local_200;
  undefined1 local_1f8 [36];
  float local_1d4;
  float local_1d0;
  float local_1cc;
  float local_1c8;
  float local_1c4;
  float local_1c0;
  float local_1bc;
  float local_1b8 [4];
  Vec4 local_1a8;
  float local_198 [8];
  float local_178 [8];
  float local_158 [8];
  float local_138 [6];
  PixelBufferAccess *local_120;
  float local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined1 local_108 [16];
  Sampler *local_f8;
  ConstPixelBufferAccess *local_f0;
  ConstPixelBufferAccess *local_e8;
  float afStack_e0 [10];
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> local_b8;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  Texture2DArrayView local_78;
  undefined1 local_68 [16];
  float local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 local_48 [16];
  
  local_b8.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8 = &sampleParams->sampler;
  local_120 = errorMask;
  local_e8 = reference;
  TVar20 = tcu::getEffectiveTextureView(baseView,&local_b8,local_f8);
  local_78.m_levels = TVar20.m_levels;
  local_78.m_numLevels = TVar20.m_numLevels;
  afStack_e0[3] = 0.0;
  afStack_e0[2] = 0.0;
  if (0 < local_78.m_numLevels) {
    afStack_e0[2] = (float)((local_78.m_levels)->m_size).m_data[0];
    afStack_e0[3] = (float)((local_78.m_levels)->m_size).m_data[1];
  }
  local_138[0] = *texCoord;
  local_158[0] = texCoord[1];
  local_138[1] = texCoord[3];
  local_138[2] = texCoord[6];
  local_138[3] = texCoord[9];
  local_158[1] = texCoord[4];
  local_158[2] = texCoord[7];
  local_158[3] = texCoord[10];
  local_178[0] = texCoord[2];
  local_178[1] = texCoord[5];
  local_178[2] = texCoord[8];
  local_238 = (float)(result->m_size).m_data[0];
  local_178[3] = texCoord[0xb];
  local_268._20_4_ = (undefined4)(result->m_size).m_data[1];
  local_220[0] = 0.0;
  local_220[1] = 0.0;
  lVar8 = 0;
  do {
    local_220[lVar8] = (float)(int)afStack_e0[lVar8 + 2];
    lVar8 = lVar8 + 1;
  } while (lVar8 == 1);
  local_198[0] = (sampleParams->super_RenderParams).w.m_data[0];
  local_198[1] = (sampleParams->super_RenderParams).w.m_data[1];
  local_198[2] = (sampleParams->super_RenderParams).w.m_data[2];
  local_198[3] = (sampleParams->super_RenderParams).w.m_data[3];
  fVar11 = 0.0;
  if (((sampleParams->super_RenderParams).flags & 2) != 0) {
    fVar11 = (sampleParams->super_RenderParams).bias;
  }
  lVar8 = 0;
  do {
    afStack_e0[lVar8] = fVar11;
    lVar8 = lVar8 + 1;
  } while (lVar8 == 1);
  afStack_e0[2] = -1.0;
  afStack_e0[3] = 0.0;
  afStack_e0[4] = 1.0;
  afStack_e0[5] = 0.0;
  afStack_e0[6] = 0.0;
  afStack_e0[7] = -1.0;
  afStack_e0[8] = 0.0;
  afStack_e0[9] = 1.0;
  local_1b8[0] = -1.7146522e+38;
  local_198[4] = local_198[2];
  local_198[5] = local_198[1];
  local_178[4] = local_178[2];
  local_178[5] = local_178[1];
  local_158[4] = local_158[2];
  local_158[5] = local_158[1];
  local_138[4] = local_138[2];
  local_138[5] = local_138[1];
  tcu::RGBA::toVec((RGBA *)&local_1a8);
  tcu::clear(local_120,&local_1a8);
  if ((result->m_size).m_data[1] < 1) {
    local_200 = 0;
  }
  else {
    local_200 = 0;
    z = 0;
    local_f0 = result;
    do {
      if (watchDog != (qpWatchDog *)0x0) {
        qpWatchDog_touch(watchDog);
      }
      if (0 < (result->m_size).m_data[0]) {
        fVar11 = (float)z + 0.5;
        local_88 = ZEXT416((uint)fVar11);
        local_68 = ZEXT416((uint)((float)local_268._20_4_ - fVar11));
        local_98 = ZEXT416((uint)(fVar11 / (float)local_268._20_4_));
        local_1f8._28_4_ = 1.0 - fVar11 / (float)local_268._20_4_;
        y = 0;
        local_23c = z;
        do {
          tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)local_268,(int)result,y,z)
          ;
          local_1b8[0] = 0.0;
          local_1b8[1] = 0.0;
          local_1b8[2] = 0.0;
          local_1b8[3] = 0.0;
          lVar8 = 0;
          do {
            local_1b8[lVar8] =
                 *(float *)(local_268 + lVar8 * 4) -
                 (sampleParams->super_RenderParams).colorBias.m_data[lVar8];
            lVar8 = lVar8 + 1;
          } while (lVar8 != 4);
          local_1a8.m_data[0] = 0.0;
          local_1a8.m_data[1] = 0.0;
          local_1a8.m_data[2] = 0.0;
          local_1a8.m_data[3] = 0.0;
          lVar8 = 0;
          do {
            local_1a8.m_data[lVar8] =
                 local_1b8[lVar8] / (sampleParams->super_RenderParams).colorScale.m_data[lVar8];
            lVar8 = lVar8 + 1;
          } while (lVar8 != 4);
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_1f8,(int)local_e8,y,z);
          local_268._0_4_ = R;
          local_268._4_4_ = SNORM_INT8;
          local_268._8_4_ = 0;
          local_268._12_4_ = 0;
          lVar8 = 0;
          do {
            *(float *)(local_268 + lVar8 * 4) =
                 *(float *)(local_1f8 + lVar8 * 4) -
                 (sampleParams->super_RenderParams).colorBias.m_data[lVar8];
            lVar8 = lVar8 + 1;
          } while (lVar8 != 4);
          local_1b8[0] = 0.0;
          local_1b8[1] = 0.0;
          local_1b8[2] = 0.0;
          local_1b8[3] = 0.0;
          lVar8 = 0;
          do {
            local_1b8[lVar8] =
                 *(float *)(local_268 + lVar8 * 4) /
                 (sampleParams->super_RenderParams).colorScale.m_data[lVar8];
            lVar8 = lVar8 + 1;
          } while (lVar8 != 4);
          local_1f8._0_4_ = R;
          local_1f8._4_4_ = SNORM_INT8;
          local_1f8._8_4_ = 0;
          local_1f8._12_4_ = 0;
          lVar8 = 0;
          do {
            *(float *)(local_1f8 + lVar8 * 4) = local_1a8.m_data[lVar8] - local_1b8[lVar8];
            lVar8 = lVar8 + 1;
          } while (lVar8 != 4);
          local_268._0_4_ = R;
          local_268._4_4_ = SNORM_INT8;
          local_268._8_4_ = 0;
          local_268._12_4_ = 0;
          lVar8 = 0;
          do {
            fVar11 = *(float *)(local_1f8 + lVar8 * 4);
            auVar13._0_4_ = -fVar11;
            auVar13._4_4_ = 0x80000000;
            auVar13._8_4_ = 0x80000000;
            auVar13._12_4_ = 0x80000000;
            if (auVar13._0_4_ <= fVar11) {
              auVar13._0_4_ = fVar11;
            }
            *(int *)(local_268 + lVar8 * 4) = auVar13._0_4_;
            lVar8 = lVar8 + 1;
          } while (lVar8 != 4);
          local_248 = (void *)((ulong)local_248 & 0xffffffff00000000);
          lVar8 = 0;
          do {
            *(bool *)((long)&local_248 + lVar8) =
                 *(float *)(local_268 + lVar8 * 4) <= (lookupPrec->colorThreshold).m_data[lVar8];
            lVar8 = lVar8 + 1;
          } while (lVar8 != 4);
          if ((char)local_248 == '\0') {
LAB_0050fc7e:
            fVar16 = (float)y + 0.5;
            fVar12 = fVar16 / local_238;
            local_118 = (float)local_98._0_4_ + fVar12;
            uStack_114 = local_98._4_4_;
            uStack_110 = local_98._8_4_;
            uStack_10c = local_98._12_4_;
            fVar11 = (float)local_98._0_4_;
            local_220[3] = fVar16;
            if (1.0 <= local_118) {
              fVar12 = 1.0 - fVar12;
              fVar11 = (float)local_1f8._28_4_;
              local_220[3] = local_238 - fVar16;
            }
            uVar6 = (ulong)(1.0 <= local_118);
            fVar14 = local_138[uVar6 * 3];
            fVar15 = local_138[uVar6 * 3 + 1];
            fVar17 = (1.0 - fVar12) - fVar11;
            fVar1 = local_198[uVar6 * 3];
            local_20c = local_198[uVar6 * 3 + 1];
            fVar2 = local_138[uVar6 * 3 + 2];
            local_210 = local_198[uVar6 * 3 + 2];
            fVar19 = fVar12 / local_210 + fVar11 / local_20c + fVar17 / fVar1;
            fVar3 = local_158[uVar6 * 3];
            fVar4 = local_158[uVar6 * 3 + 1];
            fVar5 = local_158[uVar6 * 3 + 2];
            local_1f8._4_4_ =
                 ((fVar12 * fVar5) / local_210 +
                 (fVar11 * fVar4) / local_20c + (fVar17 * fVar3) / fVar1) / fVar19;
            local_1f8._0_4_ =
                 ((fVar12 * fVar2) / local_210 +
                 (fVar11 * fVar15) / local_20c + (fVar17 * fVar14) / fVar1) / fVar19;
            local_1f8._8_4_ =
                 ((local_178[uVar6 * 3 + 2] * fVar12) / local_210 +
                 (local_178[uVar6 * 3 + 1] * fVar11) / local_20c +
                 (fVar17 * local_178[uVar6 * 3]) / fVar1) / fVar19;
            local_22c = local_20c * local_210;
            fVar19 = fVar11 + -1.0;
            local_1bc = local_210 * local_238;
            fVar18 = (local_238 * fVar19 + fVar16) * local_22c -
                     (local_1bc * fVar11 + fVar16 * local_20c) * fVar1;
            local_1c0 = (fVar15 - fVar14) * local_210 + (fVar2 - fVar15) * fVar1;
            local_1c4 = (fVar14 - fVar2) * local_20c;
            local_1c8 = (fVar4 - fVar3) * local_210 + (fVar5 - fVar4) * fVar1;
            local_1cc = (fVar3 - fVar5) * local_20c;
            fVar16 = fVar1 * local_20c * local_210;
            fVar17 = fVar16 * local_238;
            fVar18 = fVar18 * fVar18;
            local_48 = ZEXT416((uint)fVar17);
            local_268._4_4_ = ((fVar19 * local_1cc + fVar11 * local_1c8) * fVar17) / fVar18;
            local_268._0_4_ = ((local_1c4 * fVar19 + fVar11 * local_1c0) * fVar17) / fVar18;
            local_58 = -fVar1;
            local_248 = (void *)0x0;
            lVar8 = 0;
            do {
              *(float *)((long)&local_248 + lVar8 * 4) =
                   *(float *)(local_268 + lVar8 * 4) * local_220[lVar8];
              lVar8 = lVar8 + 1;
            } while (lVar8 == 1);
            fVar11 = fVar12 + -1.0;
            local_1d0 = local_20c * (float)local_268._20_4_;
            uStack_54 = 0x80000000;
            uStack_50 = 0x80000000;
            uStack_4c = 0x80000000;
            fVar17 = ((float)local_268._20_4_ * fVar11 + (float)local_88._0_4_) * local_22c +
                     (local_1d0 * fVar12 + (float)local_88._0_4_ * local_210) * local_58;
            local_1d4 = (fVar14 - fVar15) * local_210;
            local_230 = (fVar15 - fVar2) * fVar1 + (fVar2 - fVar14) * local_20c;
            local_234 = (fVar4 - fVar5) * fVar1 + (fVar5 - fVar3) * local_20c;
            local_1f8._32_4_ = (fVar3 - fVar4) * local_210;
            fVar16 = fVar16 * (float)local_268._20_4_;
            fVar17 = fVar17 * fVar17;
            local_108 = ZEXT416((uint)fVar16);
            local_268._4_4_ =
                 ((fVar11 * (float)local_1f8._32_4_ + fVar12 * local_234) * fVar16) / fVar17;
            local_268._0_4_ = ((local_1d4 * fVar11 + fVar12 * local_230) * fVar16) / fVar17;
            local_1f8._16_4_ = 0;
            local_1f8._20_4_ = 0;
            lVar8 = 0;
            do {
              *(float *)(local_1f8 + lVar8 * 4 + 0x10) =
                   *(float *)(local_268 + lVar8 * 4) * local_220[lVar8];
              lVar8 = lVar8 + 1;
            } while (lVar8 == 1);
            tcu::computeLodBoundsFromDerivates
                      ((tcu *)local_208,(float)local_248,local_248._4_4_,(float)local_1f8._16_4_,
                       (float)local_1f8._20_4_,lodPrec);
            local_118 = (float)(~-(uint)(1.0 <= local_118) & local_88._0_4_ |
                               -(uint)(1.0 <= local_118) & local_68._0_4_);
            uStack_114 = local_88._4_4_;
            uStack_110 = local_88._8_4_;
            uStack_10c = local_88._12_4_;
            lVar8 = 0;
            do {
              fVar11 = afStack_e0[lVar8 * 2 + 2] + local_220[3];
              fVar12 = afStack_e0[lVar8 * 2 + 3] + local_118;
              fVar15 = fVar12 / (float)local_268._20_4_;
              fVar16 = fVar15 + -1.0;
              fVar14 = (local_238 * fVar16 + fVar11) * local_22c +
                       (local_1bc * fVar15 + local_20c * fVar11) * local_58;
              fVar14 = fVar14 * fVar14;
              local_250[1] = ((fVar16 * local_1cc + fVar15 * local_1c8) * (float)local_48._0_4_) /
                             fVar14;
              local_250[0] = ((local_1c4 * fVar16 + local_1c0 * fVar15) * (float)local_48._0_4_) /
                             fVar14;
              local_268._0_4_ = R;
              local_268._4_4_ = SNORM_INT8;
              lVar9 = 0;
              do {
                *(float *)(local_268 + lVar9 * 4) = local_250[lVar9] * local_220[lVar9];
                lVar9 = lVar9 + 1;
              } while (lVar9 == 1);
              fVar11 = fVar11 / local_238;
              fVar16 = fVar11 + -1.0;
              fVar12 = ((float)local_268._20_4_ * fVar16 + fVar12) * local_22c +
                       (local_1d0 * fVar11 + fVar12 * local_210) * local_58;
              fVar12 = fVar12 * fVar12;
              local_228._0_4_ =
                   ((local_1d4 * fVar16 + local_230 * fVar11) * (float)local_108._0_4_) / fVar12;
              local_228._4_4_ =
                   ((fVar16 * (float)local_1f8._32_4_ + fVar11 * local_234) * (float)local_108._0_4_
                   ) / fVar12;
              local_250[0] = 0.0;
              local_250[1] = 0.0;
              lVar9 = 0;
              do {
                local_250[lVar9] = *(float *)((long)&local_228 + lVar9 * 4) * local_220[lVar9];
                lVar9 = lVar9 + 1;
              } while (lVar9 == 1);
              tcu::computeLodBoundsFromDerivates
                        ((tcu *)&local_228,(float)local_268._0_4_,(float)local_268._4_4_,
                         local_250[0],local_250[1],lodPrec);
              local_208[0] = (float)(~-(uint)(local_208[0] <= (float)local_228) &
                                     (uint)(float)local_228 |
                                    (uint)local_208[0] & -(uint)(local_208[0] <= (float)local_228));
              local_208[1] = (float)(~-(uint)(local_228._4_4_ <= local_208[1]) &
                                     (uint)local_228._4_4_ |
                                    (uint)local_208[1] & -(uint)(local_228._4_4_ <= local_208[1]));
              lVar8 = lVar8 + 1;
            } while (lVar8 != 4);
            local_268._0_4_ = R;
            local_268._4_4_ = SNORM_INT8;
            lVar8 = 0;
            do {
              *(float *)(local_268 + lVar8 * 4) = local_208[lVar8] + afStack_e0[lVar8];
              lVar8 = lVar8 + 1;
            } while (lVar8 == 1);
            local_228._0_4_ = sampleParams->minLod;
            local_228._4_4_ = sampleParams->maxLod;
            tcu::clampLodBounds((tcu *)local_250,(Vec2 *)local_268,(Vec2 *)&local_228,lodPrec);
            bVar7 = tcu::isLookupResultValid
                              (&local_78,local_f8,lookupPrec,(Vec3 *)local_1f8,(Vec2 *)local_250,
                               &local_1a8);
            z = local_23c;
            if (!bVar7) {
              local_228 = CONCAT44(local_228._4_4_,0xff0000ff);
              tcu::RGBA::toVec((RGBA *)local_268);
              tcu::PixelBufferAccess::setPixel(local_120,(Vec4 *)local_268,y,local_23c,0);
              local_200 = (ulong)((int)local_200 + 1);
              z = local_23c;
            }
          }
          else {
            uVar6 = 0;
            do {
              uVar10 = uVar6;
              if (uVar10 == 3) break;
              uVar6 = uVar10 + 1;
            } while (*(char *)((long)&local_248 + uVar10 + 1) != '\0');
            if (uVar10 < 3) goto LAB_0050fc7e;
          }
          y = y + 1;
          result = local_f0;
        } while (y < (local_f0->m_size).m_data[0]);
      }
      z = z + 1;
    } while (z < (result->m_size).m_data[1]);
  }
  if (local_b8.
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.
                    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (int)local_200;
}

Assistant:

int computeTextureLookupDiff (const tcu::ConstPixelBufferAccess&	result,
							  const tcu::ConstPixelBufferAccess&	reference,
							  const tcu::PixelBufferAccess&			errorMask,
							  const tcu::Texture2DArrayView&		baseView,
							  const float*							texCoord,
							  const ReferenceParams&				sampleParams,
							  const tcu::LookupPrecision&			lookupPrec,
							  const tcu::LodPrecision&				lodPrec,
							  qpWatchDog*							watchDog)
{
	DE_ASSERT(result.getWidth() == reference.getWidth() && result.getHeight() == reference.getHeight());
	DE_ASSERT(result.getWidth() == errorMask.getWidth() && result.getHeight() == errorMask.getHeight());

	std::vector<tcu::ConstPixelBufferAccess>	srcLevelStorage;
	const tcu::Texture2DArrayView				src					= getEffectiveTextureView(baseView, srcLevelStorage, sampleParams.sampler);

	const tcu::Vec4								sq					= tcu::Vec4(texCoord[0+0], texCoord[3+0], texCoord[6+0], texCoord[9+0]);
	const tcu::Vec4								tq					= tcu::Vec4(texCoord[0+1], texCoord[3+1], texCoord[6+1], texCoord[9+1]);
	const tcu::Vec4								rq					= tcu::Vec4(texCoord[0+2], texCoord[3+2], texCoord[6+2], texCoord[9+2]);

	const tcu::IVec2							dstSize				= tcu::IVec2(result.getWidth(), result.getHeight());
	const float									dstW				= float(dstSize.x());
	const float									dstH				= float(dstSize.y());
	const tcu::Vec2								srcSize				= tcu::IVec2(src.getWidth(), src.getHeight()).asFloat(); // For lod computation, thus #layers is ignored.

	// Coordinates and lod per triangle.
	const tcu::Vec3								triS[2]				= { sq.swizzle(0, 1, 2), sq.swizzle(3, 2, 1) };
	const tcu::Vec3								triT[2]				= { tq.swizzle(0, 1, 2), tq.swizzle(3, 2, 1) };
	const tcu::Vec3								triR[2]				= { rq.swizzle(0, 1, 2), rq.swizzle(3, 2, 1) };
	const tcu::Vec3								triW[2]				= { sampleParams.w.swizzle(0, 1, 2), sampleParams.w.swizzle(3, 2, 1) };

	const tcu::Vec2								lodBias				((sampleParams.flags & ReferenceParams::USE_BIAS) ? sampleParams.bias : 0.0f);

	int											numFailed			= 0;

	const tcu::Vec2 lodOffsets[] =
	{
		tcu::Vec2(-1,  0),
		tcu::Vec2(+1,  0),
		tcu::Vec2( 0, -1),
		tcu::Vec2( 0, +1),
	};

	tcu::clear(errorMask, tcu::RGBA::green().toVec());

	for (int py = 0; py < result.getHeight(); py++)
	{
		// Ugly hack, validation can take way too long at the moment.
		if (watchDog)
			qpWatchDog_touch(watchDog);

		for (int px = 0; px < result.getWidth(); px++)
		{
			const tcu::Vec4	resPix	= (result.getPixel(px, py)		- sampleParams.colorBias) / sampleParams.colorScale;
			const tcu::Vec4	refPix	= (reference.getPixel(px, py)	- sampleParams.colorBias) / sampleParams.colorScale;

			// Try comparison to ideal reference first, and if that fails use slower verificator.
			if (!tcu::boolAll(tcu::lessThanEqual(tcu::abs(resPix - refPix), lookupPrec.colorThreshold)))
			{
				const float		wx		= (float)px + 0.5f;
				const float		wy		= (float)py + 0.5f;
				const float		nx		= wx / dstW;
				const float		ny		= wy / dstH;

				const int		triNdx	= nx + ny >= 1.0f ? 1 : 0;
				const float		triWx	= triNdx ? dstW - wx : wx;
				const float		triWy	= triNdx ? dstH - wy : wy;
				const float		triNx	= triNdx ? 1.0f - nx : nx;
				const float		triNy	= triNdx ? 1.0f - ny : ny;

				const tcu::Vec3	coord		(projectedTriInterpolate(triS[triNdx], triW[triNdx], triNx, triNy),
											 projectedTriInterpolate(triT[triNdx], triW[triNdx], triNx, triNy),
											 projectedTriInterpolate(triR[triNdx], triW[triNdx], triNx, triNy));
				const tcu::Vec2	coordDx		= tcu::Vec2(triDerivateX(triS[triNdx], triW[triNdx], wx, dstW, triNy),
														triDerivateX(triT[triNdx], triW[triNdx], wx, dstW, triNy)) * srcSize;
				const tcu::Vec2	coordDy		= tcu::Vec2(triDerivateY(triS[triNdx], triW[triNdx], wy, dstH, triNx),
														triDerivateY(triT[triNdx], triW[triNdx], wy, dstH, triNx)) * srcSize;

				tcu::Vec2		lodBounds	= tcu::computeLodBoundsFromDerivates(coordDx.x(), coordDx.y(), coordDy.x(), coordDy.y(), lodPrec);

				// Compute lod bounds across lodOffsets range.
				for (int lodOffsNdx = 0; lodOffsNdx < DE_LENGTH_OF_ARRAY(lodOffsets); lodOffsNdx++)
				{
					const float		wxo		= triWx + lodOffsets[lodOffsNdx].x();
					const float		wyo		= triWy + lodOffsets[lodOffsNdx].y();
					const float		nxo		= wxo/dstW;
					const float		nyo		= wyo/dstH;

					const tcu::Vec2	coordDxo	= tcu::Vec2(triDerivateX(triS[triNdx], triW[triNdx], wxo, dstW, nyo),
															triDerivateX(triT[triNdx], triW[triNdx], wxo, dstW, nyo)) * srcSize;
					const tcu::Vec2	coordDyo	= tcu::Vec2(triDerivateY(triS[triNdx], triW[triNdx], wyo, dstH, nxo),
															triDerivateY(triT[triNdx], triW[triNdx], wyo, dstH, nxo)) * srcSize;
					const tcu::Vec2	lodO		= tcu::computeLodBoundsFromDerivates(coordDxo.x(), coordDxo.y(), coordDyo.x(), coordDyo.y(), lodPrec);

					lodBounds.x() = de::min(lodBounds.x(), lodO.x());
					lodBounds.y() = de::max(lodBounds.y(), lodO.y());
				}

				const tcu::Vec2	clampedLod	= tcu::clampLodBounds(lodBounds + lodBias, tcu::Vec2(sampleParams.minLod, sampleParams.maxLod), lodPrec);
				const bool		isOk		= tcu::isLookupResultValid(src, sampleParams.sampler, lookupPrec, coord, clampedLod, resPix);

				if (!isOk)
				{
					errorMask.setPixel(tcu::RGBA::red().toVec(), px, py);
					numFailed += 1;
				}
			}
		}
	}

	return numFailed;
}